

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindInIndex(Parse *pParse,Expr *pX,int *prNotFound)

{
  double dVar1;
  int p1;
  sqlite3 *db_00;
  Table *pTab_00;
  Expr *pRight;
  int iVar2;
  int iDb_00;
  int iVar3;
  int iVar4;
  Vdbe *p_00;
  CollSeq *pCVar5;
  CollSeq *pCVar6;
  KeyInfo *zP4;
  bool bVar7;
  Select *local_a0;
  int local_94;
  int rMayHaveNull;
  double savedNQueryLoop;
  char *pKey;
  int iAddr_1;
  int affinity_ok;
  CollSeq *pReq;
  Index *pIdx;
  int iAddr;
  int iDb;
  int iCol;
  Expr *pExpr;
  Table *pTab;
  sqlite3 *db;
  Vdbe *v;
  int mustBeUnique;
  int iTab;
  int eType;
  Select *p;
  int *prNotFound_local;
  Expr *pX_local;
  Parse *pParse_local;
  
  mustBeUnique = 0;
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  p_00 = sqlite3GetVdbe(pParse);
  if ((pX->flags & 0x800) == 0x800) {
    local_a0 = (pX->x).pSelect;
  }
  else {
    local_a0 = (Select *)0x0;
  }
  if ((pParse->nErr == 0) && (iVar2 = isCandidateForInOpt(local_a0), iVar2 != 0)) {
    db_00 = pParse->db;
    pTab_00 = local_a0->pSrc->a[0].pTab;
    pRight = local_a0->pEList->a->pExpr;
    iVar2 = (int)pRight->iColumn;
    iDb_00 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
    sqlite3CodeVerifySchema(pParse,iDb_00);
    sqlite3TableLock(pParse,iDb_00,pTab_00->tnum,'\0',pTab_00->zName);
    if (iVar2 < 0) {
      iVar2 = sqlite3CodeOnce(pParse);
      sqlite3OpenTable(pParse,p1,iDb_00,pTab_00,0x27);
      mustBeUnique = 1;
      sqlite3VdbeJumpHere(p_00,iVar2);
    }
    else {
      pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pRight);
      iVar3 = sqlite3IndexAffinityOk(pX,pTab_00->aCol[iVar2].affinity);
      pReq = (CollSeq *)pTab_00->pIndex;
      while( true ) {
        bVar7 = false;
        if ((pReq != (CollSeq *)0x0) && (bVar7 = false, mustBeUnique == 0)) {
          bVar7 = iVar3 != 0;
        }
        if (!bVar7) break;
        if (((**(int **)&pReq->enc == iVar2) &&
            (pCVar6 = sqlite3FindCollSeq(db_00,db_00->aDb->pSchema->enc,*(char **)pReq[1].xCmp,0),
            pCVar6 == pCVar5)) &&
           ((prNotFound != (int *)0x0 ||
            ((*(short *)((long)&pReq[1].xDel + 4) == 1 &&
             (*(char *)((long)&pReq[1].xDel + 6) != '\0')))))) {
          zP4 = sqlite3IndexKeyinfo(pParse,(Index *)pReq);
          iVar4 = sqlite3CodeOnce(pParse);
          sqlite3VdbeAddOp4(p_00,0x27,p1,*(int *)&pReq[1].xDel,iDb_00,(char *)zP4,-0x10);
          mustBeUnique = *pReq[1].pUser + 3;
          sqlite3VdbeJumpHere(p_00,iVar4);
          if ((prNotFound != (int *)0x0) && (pTab_00->aCol[iVar2].notNull == '\0')) {
            iVar4 = pParse->nMem + 1;
            pParse->nMem = iVar4;
            *prNotFound = iVar4;
            sqlite3VdbeAddOp2(p_00,10,0,*prNotFound);
          }
        }
        pReq = (CollSeq *)pReq[1].zName;
      }
    }
  }
  if (mustBeUnique == 0) {
    dVar1 = pParse->nQueryLoop;
    local_94 = 0;
    mustBeUnique = 2;
    if (prNotFound == (int *)0x0) {
      pParse->nQueryLoop = 1.0;
      if ((pX->pLeft->iColumn < 0) && ((pX->flags & 0x800) == 0)) {
        mustBeUnique = 1;
      }
    }
    else {
      local_94 = pParse->nMem + 1;
      pParse->nMem = local_94;
      *prNotFound = local_94;
      sqlite3VdbeAddOp2(p_00,10,0,*prNotFound);
    }
    sqlite3CodeSubselect(pParse,pX,local_94,(uint)(mustBeUnique == 1));
    pParse->nQueryLoop = dVar1;
  }
  else {
    pX->iTable = p1;
  }
  return mustBeUnique;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, int *prNotFound){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique = (prNotFound==0);   /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    int iCol;                              /* Index of column <column> */
    int iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = pExpr->iColumn;
   
    /* Code an OP_VerifyCookie and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr;

      iAddr = sqlite3CodeOnce(pParse);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nColumn==1 && pIdx->onError!=OE_None))
        ){
          int iAddr;
          char *pKey;
  
          pKey = (char *)sqlite3IndexKeyinfo(pParse, pIdx);
          iAddr = sqlite3CodeOnce(pParse);
  
          sqlite3VdbeAddOp4(v, OP_OpenRead, iTab, pIdx->tnum, iDb,
                               pKey,P4_KEYINFO_HANDOFF);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          sqlite3VdbeJumpHere(v, iAddr);
          if( prNotFound && !pTab->aCol[iCol].notNull ){
            *prNotFound = ++pParse->nMem;
            sqlite3VdbeAddOp2(v, OP_Null, 0, *prNotFound);
          }
        }
      }
    }
  }

  if( eType==0 ){
    /* Could not found an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    double savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( prNotFound ){
      *prNotFound = rMayHaveNull = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, *prNotFound);
    }else{
      testcase( pParse->nQueryLoop>(double)1 );
      pParse->nQueryLoop = (double)1;
      if( pX->pLeft->iColumn<0 && !ExprHasAnyProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}